

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O3

bool __thiscall Glucose::DoubleOption::parse(DoubleOption *this,char *str)

{
  double dVar1;
  Option *pOVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  char *pcVar6;
  int iVar7;
  vec<Glucose::Option_*> *this_00;
  bool bVar8;
  double dVar9;
  char *end;
  char *local_20;
  
  if (*str != '-') {
    return false;
  }
  pcVar6 = (this->super_Option).name;
  lVar4 = 0;
  cVar5 = *pcVar6;
  while (cVar5 != '\0') {
    if (str[lVar4 + 1] != cVar5) {
      return false;
    }
    lVar3 = lVar4 + 1;
    lVar4 = lVar4 + 1;
    cVar5 = pcVar6[lVar3];
  }
  if (str[lVar4 + 1] != '=') {
    return false;
  }
  pcVar6 = str + lVar4 + 2;
  dVar9 = strtod(pcVar6,&local_20);
  bVar8 = local_20 != (char *)0x0;
  if (!bVar8) {
    return bVar8;
  }
  this_00 = (vec<Glucose::Option_*> *)&(this->super_Option).name;
  dVar1 = (this->range).end;
  if (dVar9 < dVar1) {
LAB_00113105:
    dVar1 = (this->range).begin;
    if (dVar1 < dVar9) {
LAB_00113120:
      this->value = dVar9;
      return bVar8;
    }
    if ((this->range).begin_inclusive == true) {
      if ((dVar9 == dVar1) && (!NAN(dVar9) && !NAN(dVar1))) goto LAB_00113120;
    }
  }
  else {
    if ((this->range).end_inclusive == true) {
      if ((dVar9 == dVar1) && (!NAN(dVar9) && !NAN(dVar1))) goto LAB_00113105;
    }
    parse();
  }
  parse();
  iVar7 = this_00->sz;
  if (iVar7 == this_00->cap) {
    vec<Glucose::Option_*>::capacity(this_00,iVar7 + 1);
    iVar7 = this_00->sz;
  }
  pOVar2 = *(Option **)pcVar6;
  this_00->sz = iVar7 + 1;
  this_00->data[iVar7] = pOVar2;
  return SUB81(pOVar2,0);
}

Assistant:

DoubleOption(const char* c, const char* n, const char* d, double def = double(), DoubleRange r = DoubleRange(-HUGE_VAL, false, HUGE_VAL, false))
        : Option(n, d, c, "<double>"), range(r), value(def) {
        // FIXME: set LC_NUMERIC to "C" to make sure that strtof/strtod parses decimal point correctly.
    }